

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O3

FreeFormatParserReturnCode __thiscall
free_format_parser::HMpsFF::parse(HMpsFF *this,HighsLogOptions *log_options,string *filename)

{
  int iVar1;
  _Bit_type *p_Var2;
  pointer pdVar3;
  pointer pdVar4;
  char cVar5;
  bool bVar6;
  Parsekey keyword;
  long lVar7;
  FreeFormatParserReturnCode FVar8;
  HMpsFF *pHVar9;
  ulong uVar10;
  ifstream f;
  allocator local_371;
  undefined1 *local_370 [2];
  undefined1 local_360 [16];
  undefined1 local_350 [536];
  ios_base local_138 [264];
  
  highsLogDev(log_options,kInfo,"readMPS: Trying to open file %s\n",(filename->_M_dataplus)._M_p);
  zstr::ifstream::ifstream((ifstream *)local_350);
  std::__cxx11::string::string((string *)local_370,(filename->_M_dataplus)._M_p,&local_371);
  zstr::ifstream::open((ifstream *)local_350,(char *)local_370,8);
  if (local_370[0] != local_360) {
    operator_delete(local_370[0]);
  }
  pHVar9 = (HMpsFF *)(local_350 + 0x88);
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 == '\0') {
    highsLogDev(log_options,kInfo,"readMPS: Not opened file OK\n");
    FVar8 = kFileNotFound;
    std::ifstream::close();
  }
  else {
    lVar7 = std::chrono::_V2::system_clock::now();
    this->start_time = (double)lVar7 / 1000000000.0;
    this->num_row = 0;
    this->num_col = 0;
    this->num_nz = 0;
    this->cost_row_location = -1;
    this->has_duplicate_row_name_ = false;
    this->has_duplicate_col_name_ = false;
    keyword = kNone;
LAB_001f3819:
    if ((kTimeout < keyword) || ((0x26000000U >> (keyword & (kFixedFormat|kMin)) & 1) == 0)) {
      bVar6 = cannotParseSection(pHVar9,log_options,keyword);
      if (bVar6) goto LAB_001f39df;
      pHVar9 = this;
      switch(keyword) {
      case kObjsense:
        keyword = parseObjsense(this,log_options,(istream *)local_350);
        break;
      default:
        keyword = parseDefault(this,log_options,(istream *)local_350);
        break;
      case kRows:
        keyword = parseRows(this,log_options,(istream *)local_350);
        break;
      case kCols:
        keyword = parseCols(this,log_options,(istream *)local_350);
        break;
      case kRhs:
        keyword = parseRhs(this,log_options,(istream *)local_350);
        break;
      case kBounds:
        keyword = parseBounds(this,log_options,(istream *)local_350);
        break;
      case kRanges:
        keyword = parseRanges(this,log_options,(istream *)local_350);
        break;
      case kQsection:
      case kQcmatrix:
        keyword = parseQuadRows(this,log_options,(istream *)local_350,keyword);
        break;
      case kQmatrix:
      case kQuadobj:
        keyword = parseHessian(this,log_options,(istream *)local_350,keyword);
        break;
      case kCsection:
        keyword = parseCones(this,log_options,(istream *)local_350);
        break;
      case kSets:
      case kSos:
        keyword = parseSos(this,log_options,(istream *)local_350,keyword);
        break;
      case kFixedFormat:
        goto switchD_001f3852_caseD_1c;
      }
      goto LAB_001f3819;
    }
    iVar1 = this->num_col;
    if (0 < (long)iVar1) {
      p_Var2 = (this->col_binary).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      pdVar3 = (this->col_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->col_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 0;
      do {
        if ((p_Var2[uVar10 >> 6 & 0x3ffffff] >> (uVar10 & 0x3f) & 1) != 0) {
          pdVar3[uVar10] = 0.0;
          pdVar4[uVar10] = 1.0;
        }
        uVar10 = uVar10 + 1;
      } while ((long)iVar1 != uVar10);
    }
    if (keyword != kFail) {
      std::ifstream::close();
      FVar8 = (uint)(keyword == kTimeout) << 2;
      goto LAB_001f39e9;
    }
LAB_001f39df:
    FVar8 = kParserError;
    std::ifstream::close();
  }
LAB_001f39e9:
  zstr::ifstream::~ifstream((ifstream *)local_350,&zstr::ifstream::VTT);
  std::ios_base::~ios_base(local_138);
  return FVar8;
switchD_001f3852_caseD_1c:
  FVar8 = kFixedFormat;
  std::ifstream::close();
  goto LAB_001f39e9;
}

Assistant:

FreeFormatParserReturnCode HMpsFF::parse(const HighsLogOptions& log_options,
                                         const std::string& filename) {
  HMpsFF::Parsekey keyword = HMpsFF::Parsekey::kNone;

  highsLogDev(log_options, HighsLogType::kInfo,
              "readMPS: Trying to open file %s\n", filename.c_str());
#ifdef ZLIB_FOUND
  zstr::ifstream f;
  try {
    f.open(filename.c_str(), std::ios::in);
  } catch (const strict_fstream::Exception& e) {
    highsLogDev(log_options, HighsLogType::kInfo, e.what());
    return FreeFormatParserReturnCode::kFileNotFound;
  }
#else
  std::ifstream f;
  f.open(filename.c_str(), std::ios::in);
#endif
  if (f.is_open()) {
    start_time = getWallTime();
    num_row = 0;
    num_col = 0;
    num_nz = 0;
    cost_row_location = -1;
    // Indicate that no duplicate rows or columns have been found
    has_duplicate_row_name_ = false;
    has_duplicate_col_name_ = false;
    // parsing loop
    while (keyword != HMpsFF::Parsekey::kFail &&
           keyword != HMpsFF::Parsekey::kEnd &&
           keyword != HMpsFF::Parsekey::kTimeout) {
      if (cannotParseSection(log_options, keyword)) {
        f.close();
        return FreeFormatParserReturnCode::kParserError;
      }
      switch (keyword) {
        case HMpsFF::Parsekey::kObjsense:
          keyword = parseObjsense(log_options, f);
          break;
        case HMpsFF::Parsekey::kRows:
          keyword = parseRows(log_options, f);
          break;
        case HMpsFF::Parsekey::kCols:
          keyword = parseCols(log_options, f);
          break;
        case HMpsFF::Parsekey::kRhs:
          keyword = parseRhs(log_options, f);
          break;
        case HMpsFF::Parsekey::kBounds:
          keyword = parseBounds(log_options, f);
          break;
        case HMpsFF::Parsekey::kRanges:
          keyword = parseRanges(log_options, f);
          break;
        case HMpsFF::Parsekey::kQmatrix:
        case HMpsFF::Parsekey::kQuadobj:
          keyword = parseHessian(log_options, f, keyword);
          break;
        case HMpsFF::Parsekey::kQsection:
        case HMpsFF::Parsekey::kQcmatrix:
          keyword = parseQuadRows(log_options, f, keyword);
          break;
        case HMpsFF::Parsekey::kCsection:
          keyword = parseCones(log_options, f);
          break;
        case HMpsFF::Parsekey::kSets:
        case HMpsFF::Parsekey::kSos:
          keyword = parseSos(log_options, f, keyword);
          break;
        case HMpsFF::Parsekey::kFail:
          f.close();
          return FreeFormatParserReturnCode::kParserError;
        case HMpsFF::Parsekey::kFixedFormat:
          f.close();
          return FreeFormatParserReturnCode::kFixedFormat;
        default:
          keyword = parseDefault(log_options, f);
          break;
      }
    }

    // Assign bounds to columns that remain binary by default
    for (HighsInt colidx = 0; colidx < num_col; colidx++) {
      if (col_binary[colidx]) {
        col_lower[colidx] = 0.0;
        col_upper[colidx] = 1.0;
      }
    }

    if (keyword == HMpsFF::Parsekey::kFail) {
      f.close();
      return FreeFormatParserReturnCode::kParserError;
    }
  } else {
    highsLogDev(log_options, HighsLogType::kInfo,
                "readMPS: Not opened file OK\n");
    f.close();
    return FreeFormatParserReturnCode::kFileNotFound;
  }

  f.close();

  if (keyword == HMpsFF::Parsekey::kTimeout)
    return FreeFormatParserReturnCode::kTimeout;

  assert(col_lower.size() == static_cast<size_t>(num_col));
  assert(row_lower.size() == static_cast<size_t>(num_row));
  return FreeFormatParserReturnCode::kSuccess;
}